

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  size_t sVar5;
  Layer *pLVar6;
  Option *pOVar7;
  long lVar8;
  int iVar9;
  ParamDict pd;
  void *local_578;
  int *piStack_570;
  size_t local_568;
  Allocator *pAStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  size_t local_548;
  undefined1 local_540 [8];
  int *local_538;
  size_t local_530;
  Allocator *local_528;
  int local_520;
  int iStack_51c;
  int iStack_518;
  int iStack_514;
  Allocator *local_510 [156];
  
  (**mb->_vptr_ModelBin)(local_540,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)local_540) {
    if (local_538 != (int *)0x0) {
      LOCK();
      *local_538 = *local_538 + 1;
      UNLOCK();
    }
    piVar2 = (this->weight_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->weight_data).data;
        pAVar4 = (this->weight_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(*(void **)((long)pvVar3 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 8))();
        }
      }
    }
    (this->weight_data).data = (void *)local_540;
    (this->weight_data).refcount = local_538;
    (this->weight_data).elemsize = local_530;
    (this->weight_data).allocator = local_528;
    (this->weight_data).dims = local_520;
    (this->weight_data).w = iStack_51c;
    (this->weight_data).h = iStack_518;
    (this->weight_data).c = iStack_514;
    (this->weight_data).cstep = (size_t)local_510[0];
  }
  if (local_538 != (int *)0x0) {
    LOCK();
    *local_538 = *local_538 + -1;
    UNLOCK();
    if (*local_538 == 0) {
      if (local_528 == (Allocator *)0x0) {
        if (local_540 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_540 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_528 + 8))();
      }
    }
  }
  iVar9 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(local_540,mb,(ulong)(uint)this->num_output,1);
      if (&this->bias_data != (Mat *)local_540) {
        if (local_538 != (int *)0x0) {
          LOCK();
          *local_538 = *local_538 + 1;
          UNLOCK();
        }
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->bias_data).data;
            pAVar4 = (this->bias_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(*(void **)((long)pvVar3 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar4 + 8))();
            }
          }
        }
        (this->bias_data).data = (void *)local_540;
        (this->bias_data).refcount = local_538;
        (this->bias_data).elemsize = local_530;
        (this->bias_data).allocator = local_528;
        (this->bias_data).dims = local_520;
        (this->bias_data).w = iStack_51c;
        (this->bias_data).h = iStack_518;
        (this->bias_data).c = iStack_514;
        (this->bias_data).cstep = (size_t)local_510[0];
      }
      if (local_538 != (int *)0x0) {
        LOCK();
        *local_538 = *local_538 + -1;
        UNLOCK();
        if (*local_538 == 0) {
          if (local_528 == (Allocator *)0x0) {
            if (local_540 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_540 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_528 + 8))();
          }
        }
      }
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term != 0) {
      (**mb->_vptr_ModelBin)(local_540,mb,1,1);
      this->weight_data_int8_scale = *(float *)local_540;
      if (local_538 != (int *)0x0) {
        LOCK();
        *local_538 = *local_538 + -1;
        UNLOCK();
        if (*local_538 == 0) {
          if (local_528 == (Allocator *)0x0) {
            if (local_540 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_540 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_528 + 8))();
          }
        }
      }
      (**mb->_vptr_ModelBin)(local_540,mb,1,1);
      this->bottom_blob_int8_scale = *(float *)local_540;
      if (local_538 != (int *)0x0) {
        LOCK();
        *local_538 = *local_538 + -1;
        UNLOCK();
        if (*local_538 == 0) {
          if (local_528 == (Allocator *)0x0) {
            if (local_540 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_540 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_528 + 8))();
          }
        }
      }
    }
    sVar5 = (this->weight_data).elemsize;
    if ((sVar5 == 1) && ((this->use_int8_inference & 1U) == 0)) {
      load_model();
      iVar9 = -1;
    }
    else {
      if ((this->use_int8_inference & 1U) != 0) {
        pLVar6 = create_layer(0x39);
        this->quantize = pLVar6;
        pLVar6 = create_layer(0x3a);
        this->dequantize = pLVar6;
      }
      iVar9 = 0;
      if ((sVar5 == 4) && (iVar9 = 0, this->use_int8_inference == true)) {
        if ((this->weight_data_int8_scale == 0.0) || (this->bottom_blob_int8_scale == 0.0)) {
          this->use_int8_inference = false;
        }
        else {
          ParamDict::ParamDict((ParamDict *)local_540);
          ParamDict::set((ParamDict *)local_540,0,this->weight_data_int8_scale);
          (*this->quantize->_vptr_Layer[2])(this->quantize,local_540);
          local_558 = 0;
          uStack_550 = 0;
          local_568 = 0;
          pAStack_560 = (Allocator *)0x0;
          local_578 = (void *)0x0;
          piStack_570 = (int *)0x0;
          local_548 = 0;
          pLVar6 = this->quantize;
          pOVar7 = get_default_option();
          (*pLVar6->_vptr_Layer[5])(pLVar6,pMVar1,&local_578,pOVar7);
          if ((local_578 == (void *)0x0) || ((long)uStack_550._4_4_ * local_548 == 0)) {
            if (piStack_570 != (int *)0x0) {
              LOCK();
              *piStack_570 = *piStack_570 + -1;
              UNLOCK();
              if (*piStack_570 == 0) {
                if (pAStack_560 == (Allocator *)0x0) {
                  if (local_578 != (void *)0x0) {
                    free(*(void **)((long)local_578 + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAStack_560 + 8))();
                }
              }
            }
            lVar8 = 0x4d8;
            do {
              piVar2 = *(int **)((long)&local_538 + lVar8);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (*(long **)((long)&local_528 + lVar8) == (long *)0x0) {
                    if (*(long *)(local_540 + lVar8) != 0) {
                      free(*(void **)(*(long *)(local_540 + lVar8) + -8));
                    }
                  }
                  else {
                    (**(code **)(**(long **)((long)&local_528 + lVar8) + 8))();
                  }
                }
              }
              *(undefined8 *)(local_540 + lVar8) = 0;
              *(undefined8 *)((long)&local_538 + lVar8) = 0;
              *(undefined8 *)((long)&local_530 + lVar8) = 0;
              *(undefined8 *)((long)local_510 + lVar8) = 0;
              *(undefined8 *)((long)&local_520 + lVar8) = 0;
              *(undefined8 *)((long)&iStack_518 + lVar8) = 0;
              lVar8 = lVar8 + -0x40;
            } while (lVar8 != -0x28);
            iVar9 = -100;
          }
          else {
            if (pMVar1 != (Mat *)&local_578) {
              if (piStack_570 != (int *)0x0) {
                LOCK();
                *piStack_570 = *piStack_570 + 1;
                UNLOCK();
              }
              piVar2 = (this->weight_data).refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar3 = (this->weight_data).data;
                  pAVar4 = (this->weight_data).allocator;
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar3 != (void *)0x0) {
                      free(*(void **)((long)pvVar3 + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)pAVar4 + 8))();
                  }
                }
              }
              (this->weight_data).data = local_578;
              (this->weight_data).refcount = piStack_570;
              (this->weight_data).elemsize = local_568;
              (this->weight_data).allocator = pAStack_560;
              (this->weight_data).dims = (int)local_558;
              (this->weight_data).w = local_558._4_4_;
              (this->weight_data).h = (int)uStack_550;
              (this->weight_data).c = uStack_550._4_4_;
              (this->weight_data).cstep = local_548;
            }
            if (piStack_570 != (int *)0x0) {
              LOCK();
              *piStack_570 = *piStack_570 + -1;
              UNLOCK();
              if (*piStack_570 == 0) {
                if (pAStack_560 == (Allocator *)0x0) {
                  if (local_578 != (void *)0x0) {
                    free(*(void **)((long)local_578 + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAStack_560 + 8))();
                }
              }
            }
            lVar8 = 0x4d8;
            do {
              piVar2 = *(int **)((long)&local_538 + lVar8);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (*(long **)((long)&local_528 + lVar8) == (long *)0x0) {
                    if (*(long *)(local_540 + lVar8) != 0) {
                      free(*(void **)(*(long *)(local_540 + lVar8) + -8));
                    }
                  }
                  else {
                    (**(code **)(**(long **)((long)&local_528 + lVar8) + 8))();
                  }
                }
              }
              *(undefined8 *)(local_540 + lVar8) = 0;
              *(undefined8 *)((long)&local_538 + lVar8) = 0;
              *(undefined8 *)((long)&local_530 + lVar8) = 0;
              *(undefined8 *)((long)local_510 + lVar8) = 0;
              *(undefined8 *)((long)&local_520 + lVar8) = 0;
              *(undefined8 *)((long)&iStack_518 + lVar8) = 0;
              lVar8 = lVar8 + -0x40;
            } while (lVar8 != -0x28);
            iVar9 = 0;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        if (weight_data_int8_scale != 0.f && bottom_blob_int8_scale != 0.f)
        {
            // quantize weight to int8
            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scale);// scale

            quantize->load_param(pd);

            Mat int8_weight_data;
            quantize->forward(weight_data, int8_weight_data);

            if (int8_weight_data.empty())
                return -100;

            weight_data = int8_weight_data;
        }
        else
        {
            // plain float32 weight, fallback to float32 inference
            use_int8_inference = false;
        }
    }

    return 0;
}